

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

void __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
::Node(void *param_1,undefined8 *param_2,undefined8 param_3)

{
  undefined8 uVar1;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *in_stack_ffffffffffffffd0;
  
  uVar1 = param_2[1];
  *(undefined8 *)param_1 = *param_2;
  *(undefined8 *)((long)param_1 + 8) = uVar1;
  SwappableNodeRefStack<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  ::SwappableNodeRefStack
            ((SwappableNodeRefStack<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
              *)((long)param_1 + 0x10));
  *(undefined8 *)&((pair<unsigned_long,_signed_char> *)((long)param_1 + 0x30))->second = param_3;
  Initialize(in_stack_ffffffffffffffd0,(pair<unsigned_long,_signed_char> *)param_1);
  return;
}

Assistant:

Node<T, _Compare>::Node(const T &value, _Compare _cmp, _Pool &pool) : \
    _value(value), _compare(_cmp), _pool(pool) {
    Initialize(value);
}